

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::doubling::
     updategroup<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator ISA,iterator SA,iterator first,iterator last)

{
  bool bVar1;
  long lVar2;
  iterator *piVar3;
  ulong uVar4;
  value_type t;
  iterator b;
  iterator a;
  iterator *in_stack_fffffffffffffed8;
  value_reference *in_stack_fffffffffffffee0;
  difference_type in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  iterator local_50;
  iterator local_40;
  iterator local_30;
  iterator local_20 [2];
  
  bitmap::BitmapArray<long>::iterator::iterator(&local_40);
  bitmap::BitmapArray<long>::iterator::iterator(&local_50);
  bitmap::BitmapArray<long>::iterator::operator=(&local_40,&local_30);
  do {
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<(&local_40,(iterator *)&stack0x00000008);
    if (!bVar1) {
      return;
    }
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x129efb);
    lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x129f18)
    ;
    if (-1 < lVar2) {
      bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_40);
      do {
        bitmap::BitmapArray<long>::iterator::operator-(&local_40,local_20);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x129f62);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x129f7f);
        bitmap::BitmapArray<long>::iterator::operator[]
                  ((iterator *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8);
        piVar3 = bitmap::BitmapArray<long>::iterator::operator++(&local_40);
        bVar1 = bitmap::BitmapArray<long>::iterator::operator<(piVar3,(iterator *)&stack0x00000008);
        in_stack_fffffffffffffef7 = false;
        if (bVar1) {
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x129fe7);
          lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x12a004);
          in_stack_fffffffffffffef7 = -1 < lVar2;
        }
      } while ((bool)in_stack_fffffffffffffef7 != false);
      in_stack_fffffffffffffee8 =
           bitmap::BitmapArray<long>::iterator::operator-(&local_50,&local_40);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12a046);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8);
      bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                        ((iterator *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      if (bVar1) {
        return;
      }
    }
    bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_40);
    do {
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12a0a9);
      uVar4 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x12a0bd);
      in_stack_fffffffffffffee0 = (value_reference *)(uVar4 ^ 0xffffffffffffffff);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12a0d3);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8);
      bitmap::BitmapArray<long>::iterator::operator++(&local_40);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12a101);
      lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x12a115);
    } while (lVar2 < 0);
    piVar3 = (iterator *)bitmap::BitmapArray<long>::iterator::operator-(&local_40,local_20);
    do {
      in_stack_fffffffffffffed8 = piVar3;
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x12a151);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x12a165);
      bitmap::BitmapArray<long>::iterator::operator[]
                ((iterator *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8);
      bitmap::BitmapArray<long>::iterator::operator++(&local_50);
      bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                        ((iterator *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    } while (bVar1);
    bitmap::BitmapArray<long>::iterator::operator++(&local_40);
  } while( true );
}

Assistant:

void updategroup(ISAIterator_type ISA, const SAIterator_type SA,
                 SAIterator_type first, SAIterator_type last) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  SAIterator_type a, b;
  value_type t;

  for (a = first; a < last; ++a) {
    if (0 <= *a) {
      b = a;
      do {
        ISA[*a] = a - SA;
      } while ((++a < last) && (0 <= *a));
      *b = b - a;
      if (last <= a) {
        break;
      }
    }
    b = a;
    do {
      *a = ~*a;
    } while (*++a < 0);
    t = a - SA;
    do {
      ISA[*b] = t;
    } while (++b <= a);
  }
}